

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

bool __thiscall OpenGliderConnection::APRSSendKeepAlive(OpenGliderConnection *this)

{
  int __flags;
  logLevelTy lVar1;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  long in_RDI;
  char sKeepAlive [120];
  bool in_stack_0000013f;
  long in_stack_00000140;
  char *in_stack_00000148;
  LTOnlineChannel *in_stack_00000150;
  string local_a8 [32];
  char local_88 [128];
  long t;
  
  t = in_RDI;
  time((time_t *)0x0);
  ts2string_abi_cxx11_(t);
  __flags = std::__cxx11::string::c_str();
  snprintf(local_88,0x78,"# LiveTraffic %s still alive at %sZ\r\n",LT_VERSION);
  std::__cxx11::string::~string(local_a8);
  lVar1 = DataRefs::GetLogLevel(&dataRefs);
  if ((int)lVar1 < 1) {
    __flags = 0x3b0c78;
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
           ,0x218,"APRSSendKeepAlive",logDEBUG,"OGN: Sending keep alive: %s",local_88);
  }
  __n = 1;
  LTOnlineChannel::DebugLogRaw
            (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_0000013f);
  sVar2 = XPMP2::TCPConnection::send
                    ((TCPConnection *)(in_RDI + 0x1e8),(int)local_88,__buf,__n,__flags);
  return (bool)((byte)sVar2 & 1);
}

Assistant:

bool OpenGliderConnection::APRSSendKeepAlive()
{
    // Prepare login string like "user LiveTrffc pass -1 vers LiveTraffic 2.20 filter r/43.3/-80.2/50 -p/oimqstunw"
    char sKeepAlive[120];
    snprintf(sKeepAlive, sizeof(sKeepAlive), OGN_APRS_KEEP_ALIVE, LT_VERSION,
             ts2string(time(nullptr)).c_str());
    LOG_MSG(logDEBUG, "OGN: Sending keep alive: %s", sKeepAlive);
    DebugLogRaw(sKeepAlive, HTTP_FLAG_SENDING);
    return tcpAprs.send(sKeepAlive);
}